

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<RPCArg,_std::allocator<RPCArg>_> *
Cat<std::vector<RPCArg,std::allocator<RPCArg>>>
          (vector<RPCArg,_std::allocator<RPCArg>_> *v1,vector<RPCArg,_std::allocator<RPCArg>_> *v2)

{
  long lVar1;
  bool bVar2;
  size_type in_RDX;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_RSI;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_RDI;
  long in_FS_OFFSET;
  RPCArg *arg;
  vector<RPCArg,_std::allocator<RPCArg>_> *__range1;
  iterator __end0;
  iterator __begin0;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffff98;
  vector<RPCArg,_std::allocator<RPCArg>_> *__lhs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::size(in_stack_ffffffffffffff98);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::size(in_stack_ffffffffffffff98);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::reserve(in_RSI,in_RDX);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::begin(in_RDI);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::end(in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                      ((__normal_iterator<RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *
                       )__lhs,(__normal_iterator<RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                               *)in_RDI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::operator*
              ((__normal_iterator<RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *)
               in_stack_ffffffffffffff98);
    std::vector<RPCArg,_std::allocator<RPCArg>_>::push_back
              (in_stack_ffffffffffffff98,(value_type *)0x1859fd2);
    __gnu_cxx::__normal_iterator<RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>::
    operator++((__normal_iterator<RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> *)
               in_stack_ffffffffffffff98);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (in_stack_ffffffffffffff98,(vector<RPCArg,_std::allocator<RPCArg>_> *)0x1859fed);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

inline V Cat(V v1, V&& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (auto& arg : v2) {
        v1.push_back(std::move(arg));
    }
    return v1;
}